

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::copy_fromHModelToHPresolve(HModel *this,HPresolve *ptr_model)

{
  undefined4 *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *in_RSI = *(undefined4 *)(in_RDI + 0x60c);
  in_RSI[1] = *(undefined4 *)(in_RDI + 0x610);
  in_RSI[4] = *(undefined4 *)(in_RDI + 0x614);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::operator=((string *)(in_RSI + 0x1ea),(string *)(in_RDI + 0x628));
  return;
}

Assistant:

void HModel::copy_fromHModelToHPresolve(HPresolve *ptr_model) {
  ptr_model->numCol  = numCol;
  ptr_model->numRow  = numRow;
  ptr_model->numTot  = numTot;
  ptr_model->Astart  = Astart;
  ptr_model->Aindex  = Aindex;
  ptr_model->Avalue  = Avalue;
  ptr_model->colCost = colCost;
  ptr_model->colLower= colLower;
  ptr_model->colUpper= colUpper;
  ptr_model->rowLower= rowLower;
  ptr_model->rowUpper= rowUpper;
  
  ptr_model->modelName = modelName;
}